

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::BuildFileInTestPool
          (ValidationErrorTest *this,FileDescriptor *file)

{
  FileDescriptor *pFVar1;
  char *in_R9;
  FileDescriptorProto file_proto;
  AssertHelper local_150;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_148;
  internal local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  string local_130;
  FileDescriptorProto local_110;
  
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  FileDescriptor::CopyTo(file,&local_110);
  pFVar1 = DescriptorPool::BuildFile(&this->pool_,&local_110);
  local_140[0] = (internal)(pFVar1 != (FileDescriptor *)0x0);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_140[0]) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,local_140,(AssertionResult *)"pool_.BuildFile(file_proto) != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x121f,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_138,local_138);
    }
  }
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

void BuildFileInTestPool(const FileDescriptor* file) {
    FileDescriptorProto file_proto;
    file->CopyTo(&file_proto);
    ASSERT_TRUE(pool_.BuildFile(file_proto) != nullptr);
  }